

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSIMDExtract
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,SIMDExtract *curr
          )

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  Literal *other;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  Literal local_a8;
  undefined1 local_90 [8];
  Literal vec;
  undefined1 local_68 [8];
  Flow flow;
  SIMDExtract *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,this_00,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    vec.type.id._0_4_ = 1;
  }
  else {
    other = Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::Literal((Literal *)local_90,other);
    switch(*(undefined4 *)(flow.breakTo.super_IString.str._M_str + 0x10)) {
    case 0:
      wasm::Literal::extractLaneSI8x16
                (&local_a8,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_a8);
      wasm::Literal::~Literal(&local_a8);
      break;
    case 1:
      wasm::Literal::extractLaneUI8x16
                (&local_c0,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_c0);
      wasm::Literal::~Literal(&local_c0);
      break;
    case 2:
      wasm::Literal::extractLaneSI16x8
                (&local_d8,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_d8);
      wasm::Literal::~Literal(&local_d8);
      break;
    case 3:
      wasm::Literal::extractLaneUI16x8
                (&local_f0,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_f0);
      wasm::Literal::~Literal(&local_f0);
      break;
    case 4:
      wasm::Literal::extractLaneI32x4
                (&local_108,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_108);
      wasm::Literal::~Literal(&local_108);
      break;
    case 5:
      wasm::Literal::extractLaneI64x2
                (&local_120,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_120);
      wasm::Literal::~Literal(&local_120);
      break;
    case 6:
      wasm::Literal::extractLaneF16x8
                (&local_138,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_138);
      wasm::Literal::~Literal(&local_138);
      break;
    case 7:
      wasm::Literal::extractLaneF32x4
                (&local_150,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_150);
      wasm::Literal::~Literal(&local_150);
      break;
    case 8:
      wasm::Literal::extractLaneF64x2
                (&local_168,(Literal *)local_90,flow.breakTo.super_IString.str._M_str[0x20]);
      Flow::Flow(__return_storage_ptr__,&local_168);
      wasm::Literal::~Literal(&local_168);
      break;
    default:
      handle_unreachable("invalid op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0x4b8);
    }
    vec.type.id._0_4_ = 1;
    wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDExtract(SIMDExtract* curr) {
    NOTE_ENTER("SIMDExtract");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    switch (curr->op) {
      case ExtractLaneSVecI8x16:
        return vec.extractLaneSI8x16(curr->index);
      case ExtractLaneUVecI8x16:
        return vec.extractLaneUI8x16(curr->index);
      case ExtractLaneSVecI16x8:
        return vec.extractLaneSI16x8(curr->index);
      case ExtractLaneUVecI16x8:
        return vec.extractLaneUI16x8(curr->index);
      case ExtractLaneVecI32x4:
        return vec.extractLaneI32x4(curr->index);
      case ExtractLaneVecI64x2:
        return vec.extractLaneI64x2(curr->index);
      case ExtractLaneVecF16x8:
        return vec.extractLaneF16x8(curr->index);
      case ExtractLaneVecF32x4:
        return vec.extractLaneF32x4(curr->index);
      case ExtractLaneVecF64x2:
        return vec.extractLaneF64x2(curr->index);
    }
    WASM_UNREACHABLE("invalid op");
  }